

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

void __thiscall rapidxml::xml_document<char>::parse<0>(xml_document<char> *this,char *text)

{
  byte *pbVar1;
  xml_attribute<char> *pxVar2;
  xml_node<char> *pxVar3;
  undefined8 *puVar4;
  byte *local_20;
  
  local_20 = (byte *)text;
  if (text == (char *)0x0) {
    __assert_fail("text",
                  "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/rapidxml/rapidxml.hpp"
                  ,0x567,"void rapidxml::xml_document<>::parse(Ch *) [Ch = char, Flags = 0]");
  }
  for (pxVar3 = (this->super_xml_node<char>).m_first_node; pxVar3 != (xml_node<char> *)0x0;
      pxVar3 = pxVar3->m_next_sibling) {
    (pxVar3->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
  }
  (this->super_xml_node<char>).m_first_node = (xml_node<char> *)0x0;
  for (pxVar2 = (this->super_xml_node<char>).m_first_attribute; pxVar2 != (xml_attribute<char> *)0x0
      ; pxVar2 = pxVar2->m_next_attribute) {
    (pxVar2->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
  }
  (this->super_xml_node<char>).m_first_attribute = (xml_attribute<char> *)0x0;
  if (((*text == -0x11) && (text[1] == -0x45)) && (text[2] == -0x41)) {
    local_20 = (byte *)(text + 3);
  }
  pbVar1 = local_20;
  while( true ) {
    do {
      local_20 = pbVar1;
      pbVar1 = local_20 + 1;
    } while (internal::lookup_tables<0>::lookup_whitespace[*local_20] != '\0');
    if (*local_20 != 0x3c) break;
    local_20 = local_20 + 1;
    pxVar3 = parse_node<0>(this,(char **)&local_20);
    pbVar1 = local_20;
    if (pxVar3 != (xml_node<char> *)0x0) {
      xml_node<char>::append_node(&this->super_xml_node<char>,pxVar3);
      pbVar1 = local_20;
    }
  }
  if (*local_20 != 0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
    *puVar4 = &PTR__exception_00120d90;
    puVar4[1] = "expected <";
    puVar4[2] = local_20;
    __cxa_throw(puVar4,&parse_error::typeinfo,std::exception::~exception);
  }
  return;
}

Assistant:

void parse(Ch *text)
        {
            assert(text);
            
            // Remove current contents
            this->remove_all_nodes();
            this->remove_all_attributes();
            
            // Parse BOM, if any
            parse_bom<Flags>(text);
            
            // Parse children
            while (1)
            {
                // Skip whitespace before node
                skip<whitespace_pred, Flags>(text);
                if (*text == 0)
                    break;

                // Parse and append new child
                if (*text == Ch('<'))
                {
                    ++text;     // Skip '<'
                    if (xml_node<Ch> *node = parse_node<Flags>(text))
                        this->append_node(node);
                }
                else
                    RAPIDXML_PARSE_ERROR("expected <", text);
            }

        }